

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void Curl_hash_clean_with_criterium(curl_hash *h,void *user,_func_int_void_ptr_void_ptr *comp)

{
  curl_llist *list;
  curl_llist_element *pcVar1;
  curl_llist_element *e;
  int iVar2;
  long lVar3;
  
  if ((h != (curl_hash *)0x0) && (0 < h->slots)) {
    lVar3 = 0;
    do {
      list = h->table[lVar3];
      pcVar1 = list->head;
      while (e = pcVar1, e != (curl_llist_element *)0x0) {
        pcVar1 = e->next;
        iVar2 = (*comp)(user,*e->ptr);
        if (iVar2 != 0) {
          Curl_llist_remove(list,e,h);
          h->size = h->size - 1;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < h->slots);
  }
  return;
}

Assistant:

void
Curl_hash_clean_with_criterium(struct curl_hash *h, void *user,
                               int (*comp)(void *, void *))
{
  struct curl_llist_element *le;
  struct curl_llist_element *lnext;
  struct curl_llist *list;
  int i;

  if(!h)
    return;

  for(i = 0; i < h->slots; ++i) {
    list = h->table[i];
    le = list->head; /* get first list entry */
    while(le) {
      struct curl_hash_element *he = le->ptr;
      lnext = le->next;
      /* ask the callback function if we shall remove this entry or not */
      if(comp(user, he->ptr)) {
        Curl_llist_remove(list, le, (void *) h);
        --h->size; /* one less entry in the hash now */
      }
      le = lnext;
    }
  }
}